

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O1

void __thiscall hmi::renderer::fill_circle(renderer *this,vec2f center,float radius,color4f color)

{
  undefined8 *puVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float local_538;
  float fStack_534;
  undefined8 local_518;
  undefined1 local_4f8 [2] [16];
  undefined8 auStack_4d0 [151];
  
  puVar1 = auStack_4d0;
  local_4f8[0]._8_4_ = color.field_0._0_4_;
  local_4f8[0]._0_8_ = center.field_0;
  local_4f8[0]._12_4_ = color.field_0._4_4_;
  lVar2 = 0;
  local_4f8[1]._0_8_ = color.field_0._8_8_;
  do {
    fVar3 = ((float)(int)lVar2 * 6.2831855) / 50.0;
    fVar4 = sinf(fVar3);
    fVar3 = cosf(fVar3);
    local_538 = center.field_0._0_4_;
    fStack_534 = center.field_0._4_4_;
    lVar2 = lVar2 + 1;
    puVar1[-2] = CONCAT44(fVar3 * radius + fStack_534,fVar4 * radius + local_538);
    local_518 = color.field_0._0_8_;
    puVar1[-1] = local_518;
    *puVar1 = color.field_0._8_8_;
    puVar1 = puVar1 + 3;
  } while (lVar2 != 0x33);
  draw(this,(vertex *)local_4f8,0x34,6);
  return;
}

Assistant:

void renderer::fill_circle(vec2f center, float radius, color4f color) {
    static constexpr int POINT_COUNT = 50;
    static constexpr float PI = 3.14159265359f;

    vertex vertices[POINT_COUNT + 2];

    vertices[0].position = center;
    vertices[0].color = color;

    for (int i = 0; i < POINT_COUNT + 1; ++i) {
      float angle = 2 * PI * i / POINT_COUNT;
      vertices[i + 1].position = center + radius * vec2f(std::sin(angle), std::cos(angle));
      vertices[i + 1].color = color;
    }

    draw(&vertices[0], POINT_COUNT + 2, GL_TRIANGLE_FAN);
  }